

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

void Gia_ManIncrSimUpdate(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Wrd_t *pVVar3;
  uint uVar4;
  int *piVar5;
  word *pwVar6;
  Vec_Int_t *pVVar7;
  word wVar8;
  size_t __size;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  pVVar7 = p->vTimeStamps;
  iVar10 = p->nObjs;
  if (iVar10 < pVVar7->nSize) {
    __assert_fail("Vec_IntSize(p->vTimeStamps) <= Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x46f,"void Gia_ManIncrSimUpdate(Gia_Man_t *)");
  }
  if (pVVar7->nSize < iVar10) {
    iVar1 = pVVar7->nCap;
    iVar9 = iVar1 * 2;
    if (iVar9 < iVar10) {
      if (iVar1 < iVar10) {
        if (pVVar7->pArray == (int *)0x0) {
          piVar5 = (int *)malloc((long)iVar10 << 2);
        }
        else {
          piVar5 = (int *)realloc(pVVar7->pArray,(long)iVar10 << 2);
        }
        pVVar7->pArray = piVar5;
        iVar9 = iVar10;
LAB_0022839e:
        if (piVar5 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar7->nCap = iVar9;
      }
    }
    else if (iVar1 < iVar9 && iVar1 < iVar10) {
      if (pVVar7->pArray == (int *)0x0) {
        piVar5 = (int *)malloc((long)iVar1 << 3);
      }
      else {
        piVar5 = (int *)realloc(pVVar7->pArray,(long)iVar1 << 3);
      }
      pVVar7->pArray = piVar5;
      goto LAB_0022839e;
    }
    uVar2 = pVVar7->nSize;
    if ((int)uVar2 < iVar10) {
      memset(pVVar7->pArray + (int)uVar2,0,(ulong)(~uVar2 + iVar10) * 4 + 4);
    }
    pVVar7->nSize = iVar10;
  }
  pVVar3 = p->vSims;
  lVar11 = (long)p->nSimWords * (long)p->nObjs;
  iVar10 = (int)lVar11;
  if (iVar10 < pVVar3->nSize) {
    __assert_fail("Vec_WrdSize(p->vSims) <= Gia_ManObjNum(p) * p->nSimWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x472,"void Gia_ManIncrSimUpdate(Gia_Man_t *)");
  }
  if (iVar10 <= pVVar3->nSize) goto LAB_002284a0;
  iVar1 = pVVar3->nCap;
  iVar9 = iVar1 * 2;
  if (iVar9 < iVar10) {
    if (iVar1 < iVar10) {
      __size = lVar11 * 8;
      if (pVVar3->pArray == (word *)0x0) {
        pwVar6 = (word *)malloc(__size);
      }
      else {
        pwVar6 = (word *)realloc(pVVar3->pArray,__size);
      }
      pVVar3->pArray = pwVar6;
      iVar9 = iVar10;
LAB_00228468:
      if (pwVar6 == (word *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
      }
      pVVar3->nCap = iVar9;
    }
  }
  else if (iVar1 < iVar9 && iVar1 < iVar10) {
    if (pVVar3->pArray == (word *)0x0) {
      pwVar6 = (word *)malloc((long)iVar1 << 4);
    }
    else {
      pwVar6 = (word *)realloc(pVVar3->pArray,(long)iVar1 << 4);
    }
    pVVar3->pArray = pwVar6;
    goto LAB_00228468;
  }
  uVar2 = pVVar3->nSize;
  if ((int)uVar2 < iVar10) {
    memset(pVVar3->pArray + (int)uVar2,0,(ulong)(~uVar2 + iVar10) * 8 + 8);
  }
  pVVar3->nSize = iVar10;
LAB_002284a0:
  uVar2 = p->iNextPi;
  uVar12 = (ulong)uVar2;
  if (p->vCis->nSize < (int)uVar2) {
    __assert_fail("p->iNextPi <= Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x475,"void Gia_ManIncrSimUpdate(Gia_Man_t *)");
  }
  pVVar7 = p->vCis;
  iVar10 = pVVar7->nSize;
  if ((int)uVar2 < iVar10) {
    do {
      if ((int)uVar2 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = pVVar7->pArray[uVar12];
      if ((iVar10 < 0) || (p->nObjs <= iVar10)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar4 = iVar10 * p->nSimWords;
      if (((int)uVar4 < 0) || (p->vSims->nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if (0 < p->nSimWords) {
        pwVar6 = p->vSims->pArray;
        lVar11 = 0;
        do {
          wVar8 = Gia_ManRandomW(0);
          pwVar6[(ulong)uVar4 + lVar11] = wVar8;
          lVar11 = lVar11 + 1;
        } while (lVar11 < p->nSimWords);
      }
      uVar12 = uVar12 + 1;
      pVVar7 = p->vCis;
      iVar10 = pVVar7->nSize;
    } while ((int)uVar12 < iVar10);
  }
  p->iNextPi = iVar10;
  return;
}

Assistant:

void Gia_ManIncrSimUpdate( Gia_Man_t * p )
{
    int i, k;
    // extend timestamp info
    assert( Vec_IntSize(p->vTimeStamps) <= Gia_ManObjNum(p) );
    Vec_IntFillExtra( p->vTimeStamps, Gia_ManObjNum(p), 0 );
    // extend simulation info
    assert( Vec_WrdSize(p->vSims) <= Gia_ManObjNum(p) * p->nSimWords );
    Vec_WrdFillExtra( p->vSims,  Gia_ManObjNum(p) * p->nSimWords,  0 );
    // extend PI info
    assert( p->iNextPi <= Gia_ManCiNum(p) );
    for ( i = p->iNextPi; i < Gia_ManCiNum(p); i++ )
    {
        word * pSims = Gia_ManBuiltInData( p, Gia_ManCiIdToId(p, i) );
        for ( k = 0; k < p->nSimWords; k++ )
            pSims[k] = Gia_ManRandomW(0);
    }
    p->iNextPi = Gia_ManCiNum(p);
}